

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O0

void print_core(int state)

{
  int iVar1;
  int iVar2;
  core *pcVar3;
  Yshort *pYVar4;
  Yshort *sp1;
  Yshort *sp;
  core *statep;
  int rule;
  int k;
  int i;
  int state_local;
  
  pcVar3 = state_table[state];
  iVar1 = pcVar3->nitems;
  for (rule = 0; rule < iVar1; rule = rule + 1) {
    pYVar4 = ritem + pcVar3->items[rule];
    for (sp1 = pYVar4; -1 < *sp1; sp1 = sp1 + 1) {
    }
    iVar2 = *sp1;
    fprintf((FILE *)verbose_file,"\t%s : ",symbol_name[rlhs[-iVar2]]);
    for (sp1 = ritem + rrhs[-iVar2]; sp1 < pYVar4; sp1 = sp1 + 1) {
      fprintf((FILE *)verbose_file,"%s ",symbol_name[*sp1]);
    }
    putc(0x2e,(FILE *)verbose_file);
    for (; -1 < *sp1; sp1 = sp1 + 1) {
      fprintf((FILE *)verbose_file," %s",symbol_name[*sp1]);
    }
    fprintf((FILE *)verbose_file,"  (%d)\n",(ulong)(-*sp1 - 2));
  }
  return;
}

Assistant:

void print_core(int state)
{
    register int i;
    register int k;
    register int rule;
    register core *statep;
    register Yshort *sp;
    register Yshort *sp1;

    statep = state_table[state];
    k = statep->nitems;

    for (i = 0; i < k; i++)
    {
	sp1 = sp = ritem + statep->items[i];

	while (*sp >= 0) ++sp;
	rule = -(*sp);
	fprintf(verbose_file, "\t%s : ", symbol_name[rlhs[rule]]);

        for (sp = ritem + rrhs[rule]; sp < sp1; sp++)
	    fprintf(verbose_file, "%s ", symbol_name[*sp]);

	putc('.', verbose_file);

	while (*sp >= 0)
	{
	    fprintf(verbose_file, " %s", symbol_name[*sp]);
	    sp++;
	}
	fprintf(verbose_file, "  (%d)\n", -2 - *sp);
    }
}